

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_sample.c
# Opt level: O0

_Bool al_play_sample(ALLEGRO_SAMPLE *spl,float gain,float pan,float speed,ALLEGRO_PLAYMODE loop,
                    ALLEGRO_SAMPLE_ID *ret_id)

{
  _Bool _Var1;
  ALLEGRO_SAMPLE *spl_00;
  ALLEGRO_SAMPLE *pAVar2;
  ALLEGRO_SAMPLE_INSTANCE *splinst;
  uint uVar3;
  uint *in_RDX;
  AUTO_SAMPLE *slot;
  uint i;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  uint local_2c;
  
  if (in_RDX != (uint *)0x0) {
    in_RDX[1] = 0xffffffff;
    *in_RDX = 0;
  }
  local_2c = 0;
  while( true ) {
    spl_00 = (ALLEGRO_SAMPLE *)(ulong)local_2c;
    pAVar2 = (ALLEGRO_SAMPLE *)_al_vector_size(&auto_samples);
    if (pAVar2 <= spl_00) {
      return false;
    }
    splinst = (ALLEGRO_SAMPLE_INSTANCE *)_al_vector_ref(&auto_samples,local_2c);
    _Var1 = al_get_sample_instance_playing
                      ((ALLEGRO_SAMPLE_INSTANCE *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if ((!_Var1) && (((splinst->es).__pad[3] & 1) == 0)) break;
    local_2c = local_2c + 1;
  }
  _Var1 = do_play_sample(splinst,spl_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0.0,
                         0x10f91a);
  if (!_Var1) {
    return false;
  }
  if (in_RDX != (uint *)0x0) {
    *in_RDX = local_2c;
    uVar3 = al_play_sample::next_id + 1;
    al_play_sample::next_id = uVar3;
    (splinst->es).__pad[2] = uVar3;
    in_RDX[1] = uVar3;
  }
  return true;
}

Assistant:

bool al_play_sample(ALLEGRO_SAMPLE *spl, float gain, float pan, float speed,
   ALLEGRO_PLAYMODE loop, ALLEGRO_SAMPLE_ID *ret_id)
{
   static int next_id = 0;
   unsigned int i;
   
   ASSERT(spl);

   if (ret_id != NULL) {
      ret_id->_id = -1;
      ret_id->_index = 0;
   }

   for (i = 0; i < _al_vector_size(&auto_samples); i++) {
      AUTO_SAMPLE *slot = _al_vector_ref(&auto_samples, i);

      if (!al_get_sample_instance_playing(slot->instance) && !slot->locked) {
         if (!do_play_sample(slot->instance, spl, gain, pan, speed, loop))
            break;

         if (ret_id != NULL) {
            ret_id->_index = (int) i;
            ret_id->_id = slot->id = ++next_id;
         }

         return true;
      }
   }

   return false;
}